

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  long *plVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  BYTE *mEnd;
  BYTE *pBVar6;
  U32 *pUVar7;
  U32 *pUVar8;
  U32 *pUVar9;
  U32 *pUVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  U32 UVar14;
  U32 UVar15;
  uint uVar16;
  size_t sVar17;
  byte bVar18;
  byte bVar19;
  uint uVar20;
  BYTE *pBVar21;
  BYTE *pBVar22;
  long lVar23;
  uint uVar24;
  long *plVar25;
  U32 UVar26;
  long *iStart;
  ulong uVar27;
  int *piVar28;
  uint uVar29;
  ulong uVar30;
  long *plVar31;
  int iVar32;
  long *plVar33;
  long *plVar34;
  long *plVar35;
  uint uVar36;
  ulong uVar38;
  U32 local_f4;
  ulong uVar37;
  
  pBVar4 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  iStart = (long *)(pBVar4 + uVar2);
  pZVar5 = ms->dictMatchState;
  uVar3 = (pZVar5->window).dictLimit;
  mEnd = (pZVar5->window).nextSrc;
  pBVar6 = (pZVar5->window).base;
  plVar25 = (long *)(pBVar6 + uVar3);
  uVar36 = ((int)pBVar6 - (int)mEnd) + uVar2;
  uVar37 = (ulong)uVar36;
  bVar18 = 0x40 - (char)(ms->cParams).hashLog;
  uVar16 = (ms->cParams).minMatch;
  pUVar7 = ms->hashTable;
  pUVar8 = ms->chainTable;
  iEnd = (BYTE *)((long)src + srcSize);
  plVar1 = (long *)((long)src + (srcSize - 8));
  pUVar9 = pZVar5->hashTable;
  pUVar10 = pZVar5->chainTable;
  plVar34 = (long *)((ulong)(((int)src - (int)iStart) + (int)mEnd == (int)plVar25) + (long)src);
  local_f4 = *rep;
  UVar15 = rep[1];
  iVar32 = (int)pBVar4;
  cVar11 = (char)(ms->cParams).chainLog;
  cVar12 = (char)(pZVar5->cParams).hashLog;
  cVar13 = (char)(pZVar5->cParams).chainLog;
  if (uVar16 == 5) {
    bVar19 = 0x40 - cVar11;
LAB_0012dc64:
    if (plVar34 < plVar1) {
      lVar23 = *plVar34;
      uVar27 = (ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
      uVar30 = (ulong)(lVar23 * -0x30e4432345000000) >> (bVar19 & 0x3f);
      uVar38 = (long)plVar34 - (long)pBVar4;
      uVar16 = pUVar7[uVar27];
      uVar24 = pUVar8[uVar30];
      UVar14 = (U32)uVar38;
      UVar26 = UVar14 + 1;
      pUVar8[uVar30] = UVar14;
      uVar20 = UVar26 - local_f4;
      pUVar7[uVar27] = UVar14;
      if (uVar20 - uVar2 < 0xfffffffd) {
        piVar28 = (int *)(pBVar4 + uVar20);
        if (uVar20 < uVar2) {
          piVar28 = (int *)(pBVar6 + (uVar20 - uVar36));
        }
        if (*piVar28 != *(int *)((long)plVar34 + 1)) goto LAB_0012dd26;
        plVar33 = (long *)((long)plVar34 + 1);
        pBVar21 = iEnd;
        if (uVar20 < uVar2) {
          pBVar21 = mEnd;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar34 + 5),(BYTE *)(piVar28 + 1),iEnd,pBVar21,
                            (BYTE *)iStart);
        lVar23 = sVar17 + 4;
        ZSTD_storeSeq(seqStore,(long)plVar33 - (long)src,src,0,sVar17 + 1);
        UVar26 = local_f4;
LAB_0012e0d2:
        local_f4 = UVar26;
        src = (void *)(lVar23 + (long)plVar33);
        plVar34 = (long *)src;
        if (src <= plVar1) {
          lVar23 = *(long *)(pBVar4 + (uVar38 & 0xffffffff) + 2);
          pUVar8[(ulong)(lVar23 * -0x30e4432345000000) >> (bVar19 & 0x3f)] = UVar14 + 2;
          pUVar7[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar14 + 2;
          lVar23 = *(long *)((long)src + -2);
          UVar14 = ((int)src + -2) - iVar32;
          pUVar8[(ulong)(lVar23 * -0x30e4432345000000) >> (bVar19 & 0x3f)] = UVar14;
          pUVar7[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar14;
          UVar14 = UVar15;
          for (; UVar15 = UVar14, plVar34 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar17 + 4)) {
            UVar14 = (int)src - iVar32;
            uVar16 = UVar14 - UVar15;
            pBVar21 = pBVar4;
            if (uVar16 < uVar2) {
              pBVar21 = pBVar6 + -uVar37;
            }
            if ((0xfffffffc < uVar16 - uVar2) || (*(int *)(pBVar21 + uVar16) != (int)*src)) break;
            pBVar22 = iEnd;
            if (uVar16 < uVar2) {
              pBVar22 = mEnd;
            }
            sVar17 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar21 + uVar16) + 4),iEnd,
                                pBVar22,(BYTE *)iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar17 + 1);
            lVar23 = *src;
            pUVar8[(ulong)(lVar23 * -0x30e4432345000000) >> (bVar19 & 0x3f)] = UVar14;
            pUVar7[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar14;
            UVar14 = local_f4;
            local_f4 = UVar15;
          }
        }
      }
      else {
LAB_0012dd26:
        if (uVar16 <= uVar2) {
          uVar16 = pUVar9[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (0x40U - cVar12 & 0x3f)];
          if ((uVar16 <= uVar3) || (*(long *)(pBVar6 + uVar16) != lVar23)) goto LAB_0012dda5;
          plVar33 = (long *)(pBVar6 + uVar16);
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)(plVar34 + 1),pBVar6 + (ulong)uVar16 + 8,iEnd,mEnd,
                              (BYTE *)iStart);
          lVar23 = sVar17 + 8;
          UVar26 = UVar14 - (uVar36 + uVar16);
          for (; ((plVar25 < plVar33 && (src < plVar34)) &&
                 (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
              plVar34 = (long *)((long)plVar34 + -1)) {
            plVar33 = (long *)((long)plVar33 + -1);
            lVar23 = lVar23 + 1;
          }
LAB_0012e0ac:
          ZSTD_storeSeq(seqStore,(long)plVar34 - (long)src,src,UVar26 + 2,lVar23 - 3);
          plVar33 = plVar34;
          UVar15 = local_f4;
          goto LAB_0012e0d2;
        }
        plVar33 = (long *)(pBVar4 + uVar16);
        if (*plVar33 == lVar23) {
          sVar17 = ZSTD_count((BYTE *)(plVar34 + 1),(BYTE *)(plVar33 + 1),iEnd);
          lVar23 = sVar17 + 8;
          UVar26 = (int)plVar34 - (int)plVar33;
          for (; ((iStart < plVar33 && (src < plVar34)) &&
                 (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
              plVar34 = (long *)((long)plVar34 + -1)) {
            plVar33 = (long *)((long)plVar33 + -1);
            lVar23 = lVar23 + 1;
          }
          goto LAB_0012e0ac;
        }
LAB_0012dda5:
        if (uVar2 < uVar24) {
          plVar33 = (long *)(pBVar4 + uVar24);
          if ((int)*plVar33 == (int)*plVar34) {
LAB_0012deca:
            lVar23 = *(long *)((long)plVar34 + 1);
            uVar27 = (ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
            plVar35 = (long *)((long)plVar34 + 1);
            uVar16 = pUVar7[uVar27];
            pUVar7[uVar27] = UVar26;
            if (uVar2 < uVar16) {
              plVar31 = (long *)(pBVar4 + uVar16);
              if (*plVar31 == lVar23) {
                sVar17 = ZSTD_count((BYTE *)((long)plVar34 + 9),(BYTE *)(plVar31 + 1),iEnd);
                lVar23 = sVar17 + 8;
                UVar26 = (int)plVar35 - (int)plVar31;
                for (; ((plVar34 = plVar35, iStart < plVar31 && (src < plVar35)) &&
                       (*(char *)((long)plVar35 + -1) == *(char *)((long)plVar31 + -1)));
                    plVar35 = (long *)((long)plVar35 + -1)) {
                  plVar31 = (long *)((long)plVar31 + -1);
                  lVar23 = lVar23 + 1;
                }
              }
              else {
LAB_0012e017:
                if (uVar24 < uVar2) {
                  sVar17 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar34 + 4),(BYTE *)((long)plVar33 + 4),iEnd,
                                      mEnd,(BYTE *)iStart);
                  lVar23 = sVar17 + 4;
                  UVar26 = UVar14 - uVar24;
                  for (; ((plVar25 < plVar33 && (src < plVar34)) &&
                         (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
                      plVar34 = (long *)((long)plVar34 + -1)) {
                    plVar33 = (long *)((long)plVar33 + -1);
                    lVar23 = lVar23 + 1;
                  }
                }
                else {
                  sVar17 = ZSTD_count((BYTE *)((long)plVar34 + 4),(BYTE *)((long)plVar33 + 4),iEnd);
                  lVar23 = sVar17 + 4;
                  UVar26 = (int)plVar34 - (int)plVar33;
                  for (; ((iStart < plVar33 && (src < plVar34)) &&
                         (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
                      plVar34 = (long *)((long)plVar34 + -1)) {
                    plVar33 = (long *)((long)plVar33 + -1);
                    lVar23 = lVar23 + 1;
                  }
                }
              }
            }
            else {
              uVar16 = pUVar9[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (0x40U - cVar12 & 0x3f)];
              if ((uVar16 <= uVar3) || (plVar31 = (long *)(pBVar6 + uVar16), *plVar31 != lVar23))
              goto LAB_0012e017;
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar34 + 9),(BYTE *)(plVar31 + 1),iEnd,mEnd,
                                  (BYTE *)iStart);
              lVar23 = sVar17 + 8;
              UVar26 = UVar26 - (uVar36 + uVar16);
              for (; ((plVar34 = plVar35, plVar25 < plVar31 && (src < plVar35)) &&
                     (*(char *)((long)plVar35 + -1) == *(char *)((long)plVar31 + -1)));
                  plVar35 = (long *)((long)plVar35 + -1)) {
                plVar31 = (long *)((long)plVar31 + -1);
                lVar23 = lVar23 + 1;
              }
            }
            goto LAB_0012e0ac;
          }
        }
        else {
          uVar24 = pUVar10[(ulong)(lVar23 * -0x30e4432345000000) >> (0x40U - cVar13 & 0x3f)];
          if ((uVar3 < uVar24) && (*(int *)(pBVar6 + uVar24) == (int)*plVar34)) {
            plVar33 = (long *)(pBVar6 + uVar24);
            uVar24 = uVar24 + uVar36;
            goto LAB_0012deca;
          }
        }
        plVar34 = (long *)((long)plVar34 + ((long)plVar34 - (long)src >> 8) + 1);
      }
      goto LAB_0012dc64;
    }
  }
  else if (uVar16 == 6) {
    bVar19 = 0x40 - cVar11;
LAB_0012d664:
    if (plVar34 < plVar1) {
      lVar23 = *plVar34;
      uVar27 = (ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
      uVar30 = (ulong)(lVar23 * -0x30e4432340650000) >> (bVar19 & 0x3f);
      uVar38 = (long)plVar34 - (long)pBVar4;
      uVar16 = pUVar7[uVar27];
      uVar24 = pUVar8[uVar30];
      UVar14 = (U32)uVar38;
      UVar26 = UVar14 + 1;
      pUVar8[uVar30] = UVar14;
      uVar20 = UVar26 - local_f4;
      pUVar7[uVar27] = UVar14;
      if (uVar20 - uVar2 < 0xfffffffd) {
        piVar28 = (int *)(pBVar4 + uVar20);
        if (uVar20 < uVar2) {
          piVar28 = (int *)(pBVar6 + (uVar20 - uVar36));
        }
        if (*piVar28 != *(int *)((long)plVar34 + 1)) goto LAB_0012d714;
        plVar33 = (long *)((long)plVar34 + 1);
        pBVar21 = iEnd;
        if (uVar20 < uVar2) {
          pBVar21 = mEnd;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar34 + 5),(BYTE *)(piVar28 + 1),iEnd,pBVar21,
                            (BYTE *)iStart);
        lVar23 = sVar17 + 4;
        ZSTD_storeSeq(seqStore,(long)plVar33 - (long)src,src,0,sVar17 + 1);
        UVar26 = local_f4;
LAB_0012daa4:
        local_f4 = UVar26;
        src = (void *)(lVar23 + (long)plVar33);
        plVar34 = (long *)src;
        if (src <= plVar1) {
          lVar23 = *(long *)(pBVar4 + (uVar38 & 0xffffffff) + 2);
          pUVar8[(ulong)(lVar23 * -0x30e4432340650000) >> (bVar19 & 0x3f)] = UVar14 + 2;
          pUVar7[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar14 + 2;
          lVar23 = *(long *)((long)src + -2);
          UVar14 = ((int)src + -2) - iVar32;
          pUVar8[(ulong)(lVar23 * -0x30e4432340650000) >> (bVar19 & 0x3f)] = UVar14;
          pUVar7[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar14;
          UVar14 = UVar15;
          for (; UVar15 = UVar14, plVar34 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar17 + 4)) {
            UVar14 = (int)src - iVar32;
            uVar16 = UVar14 - UVar15;
            pBVar21 = pBVar4;
            if (uVar16 < uVar2) {
              pBVar21 = pBVar6 + -uVar37;
            }
            if ((0xfffffffc < uVar16 - uVar2) || (*(int *)(pBVar21 + uVar16) != (int)*src)) break;
            pBVar22 = iEnd;
            if (uVar16 < uVar2) {
              pBVar22 = mEnd;
            }
            sVar17 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar21 + uVar16) + 4),iEnd,
                                pBVar22,(BYTE *)iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar17 + 1);
            lVar23 = *src;
            pUVar8[(ulong)(lVar23 * -0x30e4432340650000) >> (bVar19 & 0x3f)] = UVar14;
            pUVar7[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar14;
            UVar14 = local_f4;
            local_f4 = UVar15;
          }
        }
      }
      else {
LAB_0012d714:
        if (uVar16 <= uVar2) {
          uVar16 = pUVar9[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (0x40U - cVar12 & 0x3f)];
          if ((uVar16 <= uVar3) || (*(long *)(pBVar6 + uVar16) != lVar23)) goto LAB_0012d793;
          plVar33 = (long *)(pBVar6 + uVar16);
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)(plVar34 + 1),pBVar6 + (ulong)uVar16 + 8,iEnd,mEnd,
                              (BYTE *)iStart);
          lVar23 = sVar17 + 8;
          UVar26 = UVar14 - (uVar36 + uVar16);
          for (; ((plVar25 < plVar33 && (src < plVar34)) &&
                 (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
              plVar34 = (long *)((long)plVar34 + -1)) {
            plVar33 = (long *)((long)plVar33 + -1);
            lVar23 = lVar23 + 1;
          }
LAB_0012da7b:
          ZSTD_storeSeq(seqStore,(long)plVar34 - (long)src,src,UVar26 + 2,lVar23 - 3);
          plVar33 = plVar34;
          UVar15 = local_f4;
          goto LAB_0012daa4;
        }
        plVar33 = (long *)(pBVar4 + uVar16);
        if (*plVar33 == lVar23) {
          sVar17 = ZSTD_count((BYTE *)(plVar34 + 1),(BYTE *)(plVar33 + 1),iEnd);
          lVar23 = sVar17 + 8;
          UVar26 = (int)plVar34 - (int)plVar33;
          for (; ((iStart < plVar33 && (src < plVar34)) &&
                 (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
              plVar34 = (long *)((long)plVar34 + -1)) {
            plVar33 = (long *)((long)plVar33 + -1);
            lVar23 = lVar23 + 1;
          }
          goto LAB_0012da7b;
        }
LAB_0012d793:
        if (uVar2 < uVar24) {
          plVar33 = (long *)(pBVar4 + uVar24);
          if ((int)*plVar33 == (int)*plVar34) {
LAB_0012d8af:
            lVar23 = *(long *)((long)plVar34 + 1);
            uVar27 = (ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
            plVar35 = (long *)((long)plVar34 + 1);
            uVar16 = pUVar7[uVar27];
            pUVar7[uVar27] = UVar26;
            if (uVar2 < uVar16) {
              plVar31 = (long *)(pBVar4 + uVar16);
              if (*plVar31 == lVar23) {
                sVar17 = ZSTD_count((BYTE *)((long)plVar34 + 9),(BYTE *)(plVar31 + 1),iEnd);
                lVar23 = sVar17 + 8;
                UVar26 = (int)plVar35 - (int)plVar31;
                for (; ((plVar34 = plVar35, iStart < plVar31 && (src < plVar35)) &&
                       (*(char *)((long)plVar35 + -1) == *(char *)((long)plVar31 + -1)));
                    plVar35 = (long *)((long)plVar35 + -1)) {
                  plVar31 = (long *)((long)plVar31 + -1);
                  lVar23 = lVar23 + 1;
                }
              }
              else {
LAB_0012d9ee:
                if (uVar24 < uVar2) {
                  sVar17 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar34 + 4),(BYTE *)((long)plVar33 + 4),iEnd,
                                      mEnd,(BYTE *)iStart);
                  lVar23 = sVar17 + 4;
                  UVar26 = UVar14 - uVar24;
                  for (; ((plVar25 < plVar33 && (src < plVar34)) &&
                         (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
                      plVar34 = (long *)((long)plVar34 + -1)) {
                    plVar33 = (long *)((long)plVar33 + -1);
                    lVar23 = lVar23 + 1;
                  }
                }
                else {
                  sVar17 = ZSTD_count((BYTE *)((long)plVar34 + 4),(BYTE *)((long)plVar33 + 4),iEnd);
                  lVar23 = sVar17 + 4;
                  UVar26 = (int)plVar34 - (int)plVar33;
                  for (; ((iStart < plVar33 && (src < plVar34)) &&
                         (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
                      plVar34 = (long *)((long)plVar34 + -1)) {
                    plVar33 = (long *)((long)plVar33 + -1);
                    lVar23 = lVar23 + 1;
                  }
                }
              }
            }
            else {
              uVar16 = pUVar9[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (0x40U - cVar12 & 0x3f)];
              if ((uVar16 <= uVar3) || (plVar31 = (long *)(pBVar6 + uVar16), *plVar31 != lVar23))
              goto LAB_0012d9ee;
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar34 + 9),(BYTE *)(plVar31 + 1),iEnd,mEnd,
                                  (BYTE *)iStart);
              lVar23 = sVar17 + 8;
              UVar26 = UVar26 - (uVar36 + uVar16);
              for (; ((plVar34 = plVar35, plVar25 < plVar31 && (src < plVar35)) &&
                     (*(char *)((long)plVar35 + -1) == *(char *)((long)plVar31 + -1)));
                  plVar35 = (long *)((long)plVar35 + -1)) {
                plVar31 = (long *)((long)plVar31 + -1);
                lVar23 = lVar23 + 1;
              }
            }
            goto LAB_0012da7b;
          }
        }
        else {
          uVar24 = pUVar10[(ulong)(lVar23 * -0x30e4432340650000) >> (0x40U - cVar13 & 0x3f)];
          if ((uVar3 < uVar24) && (*(int *)(pBVar6 + uVar24) == (int)*plVar34)) {
            plVar33 = (long *)(pBVar6 + uVar24);
            uVar24 = uVar24 + uVar36;
            goto LAB_0012d8af;
          }
        }
        plVar34 = (long *)((long)plVar34 + ((long)plVar34 - (long)src >> 8) + 1);
      }
      goto LAB_0012d664;
    }
  }
  else if (uVar16 == 7) {
    bVar19 = 0x40 - cVar11;
LAB_0012d04f:
    if (plVar34 < plVar1) {
      lVar23 = *plVar34;
      uVar27 = (ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
      uVar30 = (ulong)(lVar23 * -0x30e44323405a9d00) >> (bVar19 & 0x3f);
      uVar38 = (long)plVar34 - (long)pBVar4;
      uVar16 = pUVar7[uVar27];
      uVar24 = pUVar8[uVar30];
      UVar14 = (U32)uVar38;
      UVar26 = UVar14 + 1;
      pUVar8[uVar30] = UVar14;
      uVar20 = UVar26 - local_f4;
      pUVar7[uVar27] = UVar14;
      if (uVar20 - uVar2 < 0xfffffffd) {
        piVar28 = (int *)(pBVar4 + uVar20);
        if (uVar20 < uVar2) {
          piVar28 = (int *)(pBVar6 + (uVar20 - uVar36));
        }
        if (*piVar28 != *(int *)((long)plVar34 + 1)) goto LAB_0012d0ff;
        plVar33 = (long *)((long)plVar34 + 1);
        pBVar21 = iEnd;
        if (uVar20 < uVar2) {
          pBVar21 = mEnd;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar34 + 5),(BYTE *)(piVar28 + 1),iEnd,pBVar21,
                            (BYTE *)iStart);
        lVar23 = sVar17 + 4;
        ZSTD_storeSeq(seqStore,(long)plVar33 - (long)src,src,0,sVar17 + 1);
        UVar26 = local_f4;
LAB_0012d48f:
        local_f4 = UVar26;
        src = (void *)(lVar23 + (long)plVar33);
        plVar34 = (long *)src;
        if (src <= plVar1) {
          lVar23 = *(long *)(pBVar4 + (uVar38 & 0xffffffff) + 2);
          pUVar8[(ulong)(lVar23 * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] = UVar14 + 2;
          pUVar7[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar14 + 2;
          lVar23 = *(long *)((long)src + -2);
          UVar14 = ((int)src + -2) - iVar32;
          pUVar8[(ulong)(lVar23 * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] = UVar14;
          pUVar7[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar14;
          UVar14 = UVar15;
          for (; UVar15 = UVar14, plVar34 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar17 + 4)) {
            UVar14 = (int)src - iVar32;
            uVar16 = UVar14 - UVar15;
            pBVar21 = pBVar4;
            if (uVar16 < uVar2) {
              pBVar21 = pBVar6 + -uVar37;
            }
            if ((0xfffffffc < uVar16 - uVar2) || (*(int *)(pBVar21 + uVar16) != (int)*src)) break;
            pBVar22 = iEnd;
            if (uVar16 < uVar2) {
              pBVar22 = mEnd;
            }
            sVar17 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar21 + uVar16) + 4),iEnd,
                                pBVar22,(BYTE *)iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar17 + 1);
            lVar23 = *src;
            pUVar8[(ulong)(lVar23 * -0x30e44323405a9d00) >> (bVar19 & 0x3f)] = UVar14;
            pUVar7[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar14;
            UVar14 = local_f4;
            local_f4 = UVar15;
          }
        }
      }
      else {
LAB_0012d0ff:
        if (uVar16 <= uVar2) {
          uVar16 = pUVar9[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (0x40U - cVar12 & 0x3f)];
          if ((uVar16 <= uVar3) || (*(long *)(pBVar6 + uVar16) != lVar23)) goto LAB_0012d17e;
          plVar33 = (long *)(pBVar6 + uVar16);
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)(plVar34 + 1),pBVar6 + (ulong)uVar16 + 8,iEnd,mEnd,
                              (BYTE *)iStart);
          lVar23 = sVar17 + 8;
          UVar26 = UVar14 - (uVar36 + uVar16);
          for (; ((plVar25 < plVar33 && (src < plVar34)) &&
                 (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
              plVar34 = (long *)((long)plVar34 + -1)) {
            plVar33 = (long *)((long)plVar33 + -1);
            lVar23 = lVar23 + 1;
          }
LAB_0012d466:
          ZSTD_storeSeq(seqStore,(long)plVar34 - (long)src,src,UVar26 + 2,lVar23 - 3);
          plVar33 = plVar34;
          UVar15 = local_f4;
          goto LAB_0012d48f;
        }
        plVar33 = (long *)(pBVar4 + uVar16);
        if (*plVar33 == lVar23) {
          sVar17 = ZSTD_count((BYTE *)(plVar34 + 1),(BYTE *)(plVar33 + 1),iEnd);
          lVar23 = sVar17 + 8;
          UVar26 = (int)plVar34 - (int)plVar33;
          for (; ((iStart < plVar33 && (src < plVar34)) &&
                 (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
              plVar34 = (long *)((long)plVar34 + -1)) {
            plVar33 = (long *)((long)plVar33 + -1);
            lVar23 = lVar23 + 1;
          }
          goto LAB_0012d466;
        }
LAB_0012d17e:
        if (uVar2 < uVar24) {
          plVar33 = (long *)(pBVar4 + uVar24);
          if ((int)*plVar33 == (int)*plVar34) {
LAB_0012d29a:
            lVar23 = *(long *)((long)plVar34 + 1);
            uVar27 = (ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
            plVar35 = (long *)((long)plVar34 + 1);
            uVar16 = pUVar7[uVar27];
            pUVar7[uVar27] = UVar26;
            if (uVar2 < uVar16) {
              plVar31 = (long *)(pBVar4 + uVar16);
              if (*plVar31 == lVar23) {
                sVar17 = ZSTD_count((BYTE *)((long)plVar34 + 9),(BYTE *)(plVar31 + 1),iEnd);
                lVar23 = sVar17 + 8;
                UVar26 = (int)plVar35 - (int)plVar31;
                for (; ((plVar34 = plVar35, iStart < plVar31 && (src < plVar35)) &&
                       (*(char *)((long)plVar35 + -1) == *(char *)((long)plVar31 + -1)));
                    plVar35 = (long *)((long)plVar35 + -1)) {
                  plVar31 = (long *)((long)plVar31 + -1);
                  lVar23 = lVar23 + 1;
                }
              }
              else {
LAB_0012d3d9:
                if (uVar24 < uVar2) {
                  sVar17 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar34 + 4),(BYTE *)((long)plVar33 + 4),iEnd,
                                      mEnd,(BYTE *)iStart);
                  lVar23 = sVar17 + 4;
                  UVar26 = UVar14 - uVar24;
                  for (; ((plVar25 < plVar33 && (src < plVar34)) &&
                         (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
                      plVar34 = (long *)((long)plVar34 + -1)) {
                    plVar33 = (long *)((long)plVar33 + -1);
                    lVar23 = lVar23 + 1;
                  }
                }
                else {
                  sVar17 = ZSTD_count((BYTE *)((long)plVar34 + 4),(BYTE *)((long)plVar33 + 4),iEnd);
                  lVar23 = sVar17 + 4;
                  UVar26 = (int)plVar34 - (int)plVar33;
                  for (; ((iStart < plVar33 && (src < plVar34)) &&
                         (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
                      plVar34 = (long *)((long)plVar34 + -1)) {
                    plVar33 = (long *)((long)plVar33 + -1);
                    lVar23 = lVar23 + 1;
                  }
                }
              }
            }
            else {
              uVar16 = pUVar9[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (0x40U - cVar12 & 0x3f)];
              if ((uVar16 <= uVar3) || (plVar31 = (long *)(pBVar6 + uVar16), *plVar31 != lVar23))
              goto LAB_0012d3d9;
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar34 + 9),(BYTE *)(plVar31 + 1),iEnd,mEnd,
                                  (BYTE *)iStart);
              lVar23 = sVar17 + 8;
              UVar26 = UVar26 - (uVar36 + uVar16);
              for (; ((plVar34 = plVar35, plVar25 < plVar31 && (src < plVar35)) &&
                     (*(char *)((long)plVar35 + -1) == *(char *)((long)plVar31 + -1)));
                  plVar35 = (long *)((long)plVar35 + -1)) {
                plVar31 = (long *)((long)plVar31 + -1);
                lVar23 = lVar23 + 1;
              }
            }
            goto LAB_0012d466;
          }
        }
        else {
          uVar24 = pUVar10[(ulong)(lVar23 * -0x30e44323405a9d00) >> (0x40U - cVar13 & 0x3f)];
          if ((uVar3 < uVar24) && (*(int *)(pBVar6 + uVar24) == (int)*plVar34)) {
            plVar33 = (long *)(pBVar6 + uVar24);
            uVar24 = uVar24 + uVar36;
            goto LAB_0012d29a;
          }
        }
        plVar34 = (long *)((long)plVar34 + ((long)plVar34 - (long)src >> 8) + 1);
      }
      goto LAB_0012d04f;
    }
  }
  else {
    bVar19 = 0x20 - cVar11;
LAB_0012e291:
    if (plVar34 < plVar1) {
      uVar20 = (int)*plVar34 * -0x61c8864f;
      uVar27 = *plVar34 * -0x30e44323485a9b9d;
      uVar38 = uVar27 >> (bVar18 & 0x3f);
      uVar29 = uVar20 >> (bVar19 & 0x1f);
      uVar30 = (long)plVar34 - (long)pBVar4;
      uVar16 = pUVar7[uVar38];
      uVar24 = pUVar8[uVar29];
      UVar14 = (U32)uVar30;
      UVar26 = UVar14 + 1;
      pUVar8[uVar29] = UVar14;
      uVar29 = UVar26 - local_f4;
      pUVar7[uVar38] = UVar14;
      if (uVar29 - uVar2 < 0xfffffffd) {
        piVar28 = (int *)(pBVar4 + uVar29);
        if (uVar29 < uVar2) {
          piVar28 = (int *)(pBVar6 + (uVar29 - uVar36));
        }
        if (*piVar28 != *(int *)((long)plVar34 + 1)) goto LAB_0012e338;
        plVar33 = (long *)((long)plVar34 + 1);
        pBVar21 = iEnd;
        if (uVar29 < uVar2) {
          pBVar21 = mEnd;
        }
        sVar17 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar34 + 5),(BYTE *)(piVar28 + 1),iEnd,pBVar21,
                            (BYTE *)iStart);
        lVar23 = sVar17 + 4;
        ZSTD_storeSeq(seqStore,(long)plVar33 - (long)src,src,0,sVar17 + 1);
        UVar26 = local_f4;
LAB_0012e4d9:
        local_f4 = UVar26;
        src = (void *)(lVar23 + (long)plVar33);
        plVar34 = (long *)src;
        if (src <= plVar1) {
          uVar30 = uVar30 & 0xffffffff;
          pUVar8[(uint)(*(int *)(pBVar4 + uVar30 + 2) * -0x61c8864f) >> (bVar19 & 0x1f)] =
               UVar14 + 2;
          pUVar7[(ulong)(*(long *)(pBVar4 + uVar30 + 2) * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] =
               UVar14 + 2;
          UVar14 = ((int)src + -2) - iVar32;
          pUVar8[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar19 & 0x1f)] = UVar14;
          pUVar7[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] =
               UVar14;
          UVar14 = UVar15;
          for (; UVar15 = UVar14, plVar34 = (long *)src, src <= plVar1;
              src = (void *)((long)src + sVar17 + 4)) {
            UVar14 = (int)src - iVar32;
            uVar16 = UVar14 - UVar15;
            pBVar21 = pBVar4;
            if (uVar16 < uVar2) {
              pBVar21 = pBVar6 + -uVar37;
            }
            if ((0xfffffffc < uVar16 - uVar2) || (*(int *)(pBVar21 + uVar16) != (int)*src)) break;
            pBVar22 = iEnd;
            if (uVar16 < uVar2) {
              pBVar22 = mEnd;
            }
            sVar17 = ZSTD_count_2segments
                               ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar21 + uVar16) + 4),iEnd,
                                pBVar22,(BYTE *)iStart);
            ZSTD_storeSeq(seqStore,0,src,0,sVar17 + 1);
            pUVar8[(uint)((int)*src * -0x61c8864f) >> (bVar19 & 0x1f)] = UVar14;
            pUVar7[(ulong)(*src * -0x30e44323485a9b9d) >> (bVar18 & 0x3f)] = UVar14;
            UVar14 = local_f4;
            local_f4 = UVar15;
          }
        }
      }
      else {
LAB_0012e338:
        if (uVar16 <= uVar2) {
          uVar16 = pUVar9[uVar27 >> (0x40U - cVar12 & 0x3f)];
          if ((uVar16 <= uVar3) || (*(long *)(pBVar6 + uVar16) != *plVar34)) goto LAB_0012e3b7;
          plVar33 = (long *)(pBVar6 + uVar16);
          sVar17 = ZSTD_count_2segments
                             ((BYTE *)(plVar34 + 1),pBVar6 + (ulong)uVar16 + 8,iEnd,mEnd,
                              (BYTE *)iStart);
          lVar23 = sVar17 + 8;
          UVar26 = UVar14 - (uVar36 + uVar16);
          for (; ((plVar25 < plVar33 && (src < plVar34)) &&
                 (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
              plVar34 = (long *)((long)plVar34 + -1)) {
            plVar33 = (long *)((long)plVar33 + -1);
            lVar23 = lVar23 + 1;
          }
LAB_0012e4b3:
          ZSTD_storeSeq(seqStore,(long)plVar34 - (long)src,src,UVar26 + 2,lVar23 - 3);
          plVar33 = plVar34;
          UVar15 = local_f4;
          goto LAB_0012e4d9;
        }
        plVar33 = (long *)(pBVar4 + uVar16);
        if (*plVar33 == *plVar34) {
          sVar17 = ZSTD_count((BYTE *)(plVar34 + 1),(BYTE *)(plVar33 + 1),iEnd);
          lVar23 = sVar17 + 8;
          UVar26 = (int)plVar34 - (int)plVar33;
          for (; ((iStart < plVar33 && (src < plVar34)) &&
                 (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
              plVar34 = (long *)((long)plVar34 + -1)) {
            plVar33 = (long *)((long)plVar33 + -1);
            lVar23 = lVar23 + 1;
          }
          goto LAB_0012e4b3;
        }
LAB_0012e3b7:
        if (uVar2 < uVar24) {
          plVar33 = (long *)(pBVar4 + uVar24);
          if ((int)*plVar33 == (int)*plVar34) {
LAB_0012e678:
            lVar23 = *(long *)((long)plVar34 + 1);
            uVar27 = (ulong)(lVar23 * -0x30e44323485a9b9d) >> (bVar18 & 0x3f);
            plVar35 = (long *)((long)plVar34 + 1);
            uVar16 = pUVar7[uVar27];
            pUVar7[uVar27] = UVar26;
            if (uVar2 < uVar16) {
              plVar31 = (long *)(pBVar4 + uVar16);
              if (*plVar31 == lVar23) {
                sVar17 = ZSTD_count((BYTE *)((long)plVar34 + 9),(BYTE *)(plVar31 + 1),iEnd);
                lVar23 = sVar17 + 8;
                UVar26 = (int)plVar35 - (int)plVar31;
                for (; ((plVar34 = plVar35, iStart < plVar31 && (src < plVar35)) &&
                       (*(char *)((long)plVar35 + -1) == *(char *)((long)plVar31 + -1)));
                    plVar35 = (long *)((long)plVar35 + -1)) {
                  plVar31 = (long *)((long)plVar31 + -1);
                  lVar23 = lVar23 + 1;
                }
              }
              else {
LAB_0012e7b6:
                if (uVar24 < uVar2) {
                  sVar17 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar34 + 4),(BYTE *)((long)plVar33 + 4),iEnd,
                                      mEnd,(BYTE *)iStart);
                  lVar23 = sVar17 + 4;
                  UVar26 = UVar14 - uVar24;
                  for (; ((plVar25 < plVar33 && (src < plVar34)) &&
                         (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
                      plVar34 = (long *)((long)plVar34 + -1)) {
                    plVar33 = (long *)((long)plVar33 + -1);
                    lVar23 = lVar23 + 1;
                  }
                }
                else {
                  sVar17 = ZSTD_count((BYTE *)((long)plVar34 + 4),(BYTE *)((long)plVar33 + 4),iEnd);
                  lVar23 = sVar17 + 4;
                  UVar26 = (int)plVar34 - (int)plVar33;
                  for (; ((iStart < plVar33 && (src < plVar34)) &&
                         (*(char *)((long)plVar34 + -1) == *(char *)((long)plVar33 + -1)));
                      plVar34 = (long *)((long)plVar34 + -1)) {
                    plVar33 = (long *)((long)plVar33 + -1);
                    lVar23 = lVar23 + 1;
                  }
                }
              }
            }
            else {
              uVar16 = pUVar9[(ulong)(lVar23 * -0x30e44323485a9b9d) >> (0x40U - cVar12 & 0x3f)];
              if ((uVar16 <= uVar3) || (plVar31 = (long *)(pBVar6 + uVar16), *plVar31 != lVar23))
              goto LAB_0012e7b6;
              sVar17 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar34 + 9),(BYTE *)(plVar31 + 1),iEnd,mEnd,
                                  (BYTE *)iStart);
              lVar23 = sVar17 + 8;
              UVar26 = UVar26 - (uVar36 + uVar16);
              for (; ((plVar34 = plVar35, plVar25 < plVar31 && (src < plVar35)) &&
                     (*(char *)((long)plVar35 + -1) == *(char *)((long)plVar31 + -1)));
                  plVar35 = (long *)((long)plVar35 + -1)) {
                plVar31 = (long *)((long)plVar31 + -1);
                lVar23 = lVar23 + 1;
              }
            }
            goto LAB_0012e4b3;
          }
        }
        else {
          uVar24 = pUVar10[uVar20 >> (0x20U - cVar13 & 0x1f)];
          if ((uVar3 < uVar24) && (*(int *)(pBVar6 + uVar24) == (int)*plVar34)) {
            plVar33 = (long *)(pBVar6 + uVar24);
            uVar24 = uVar24 + uVar36;
            goto LAB_0012e678;
          }
        }
        plVar34 = (long *)((long)plVar34 + ((long)plVar34 - (long)src >> 8) + 1);
      }
      goto LAB_0012e291;
    }
  }
  *rep = local_f4;
  rep[1] = UVar15;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}